

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Specific.hh
# Opt level: O0

void avro::codec_traits<std::vector<double,_std::allocator<double>_>_>::encode
               (Encoder *e,vector<double,_std::allocator<double>_> *b)

{
  Encoder *pEVar1;
  bool bVar2;
  size_type sVar3;
  vector<double,_std::allocator<double>_> *in_RSI;
  Encoder *in_RDI;
  const_iterator it;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc8;
  Encoder *in_stack_ffffffffffffffd0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_18;
  vector<double,_std::allocator<double>_> *local_10;
  Encoder *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  (**(code **)(*(long *)in_RDI + 0x70))();
  bVar2 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffffe0);
  pEVar1 = local_8;
  if (!bVar2) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(local_10);
    (**(code **)(*(long *)pEVar1 + 0x90))(pEVar1,sVar3);
    local_18._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffffc8);
    while( true ) {
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffffc8);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_ffffffffffffffd0,
                         (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_stack_ffffffffffffffc8);
      if (!bVar2) break;
      (**(code **)(*(long *)local_8 + 0x98))();
      in_stack_ffffffffffffffd0 = local_8;
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator*(&local_18);
      encode<double>(in_stack_ffffffffffffffd0,(double *)in_stack_ffffffffffffffc8);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_18);
    }
  }
  (**(code **)(*(long *)local_8 + 0x78))();
  return;
}

Assistant:

static void encode(Encoder& e, const std::vector<T>& b) {
        e.arrayStart();
        if (! b.empty()) {
            e.setItemCount(b.size());
            for (typename std::vector<T>::const_iterator it = b.begin();
                it != b.end(); ++it) {
                e.startItem();
                avro::encode(e, *it);
            }
        }
        e.arrayEnd();
    }